

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::rfind
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  char *pcVar5;
  
  uVar3 = v.size_;
  uVar1 = this->size_;
  sVar4 = 0xffffffffffffffff;
  if (uVar3 <= uVar1) {
    if (uVar3 == 0) {
      sVar4 = pos;
      if (uVar1 < pos) {
        sVar4 = uVar1;
      }
    }
    else {
      if (uVar1 - uVar3 < pos) {
        pos = uVar1 - uVar3;
      }
      pcVar5 = this->data_ + uVar3 + pos;
      pcVar2 = std::
               __find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(char_const&,char_const&)>>
                         (this->data_,pcVar5,v.data_,v.data_ + uVar3,std::char_traits<char>::eq);
      if (pcVar2 != pcVar5) {
        sVar4 = (long)pcVar2 - (long)this->data_;
      }
    }
  }
  return sVar4;
}

Assistant:

nssv_constexpr14 size_type rfind( basic_string_view v, size_type pos = npos ) const nssv_noexcept  // (1)
    {
        if ( size() < v.size() )
        {
            return npos;
        }

        if ( v.empty() )
        {
            return (std::min)( size(), pos );
        }

        const_iterator last   = cbegin() + (std::min)( size() - v.size(), pos ) + v.size();
        const_iterator result = std::find_end( cbegin(), last, v.cbegin(), v.cend(), Traits::eq );

        return result != last ? size_type( result - cbegin() ) : npos;
    }